

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O2

bool sptk::ComputeLowerAndUpperBounds
               (double confidence_level,int num_data,vector<double,_std::allocator<double>_> *mean,
               vector<double,_std::allocator<double>_> *variance,
               vector<double,_std::allocator<double>_> *lower_bound,
               vector<double,_std::allocator<double>_> *upper_bound)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  int degrees_of_freedom;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double t;
  double local_50;
  double local_48;
  
  if (0 < num_data && (0.0 < confidence_level && confidence_level < 100.0)) {
    if (upper_bound == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if (lower_bound == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    lVar6 = (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar6 != (long)(variance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(variance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) {
      return false;
    }
    local_48 = confidence_level;
    if ((long)(lower_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(lower_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar6) {
      std::vector<double,_std::allocator<double>_>::resize(lower_bound,lVar6 >> 3);
      lVar6 = (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
    }
    if ((long)(upper_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(upper_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar6) {
      std::vector<double,_std::allocator<double>_>::resize(upper_bound,lVar6 >> 3);
    }
    degrees_of_freedom = num_data + -1;
    if (degrees_of_freedom != 0) {
      bVar4 = ComputePercentagePointOfTDistribution
                        ((local_48 / -100.0 + 1.0) * 0.5,degrees_of_freedom,&local_50);
      if (!bVar4) {
        return bVar4;
      }
      dVar10 = 1.0 / (double)degrees_of_freedom;
      uVar7 = (ulong)((long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      pdVar1 = (lower_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (upper_bound->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      local_48 = dVar10;
      uVar8 = uVar7 & 0xffffffff;
      if ((int)uVar7 < 1) {
        uVar8 = uVar5;
      }
      for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        dVar9 = (variance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar5] * dVar10;
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
          dVar10 = local_48;
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        pdVar3 = (mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1[uVar5] = pdVar3[uVar5] - local_50 * dVar9;
        pdVar2[uVar5] = dVar9 * local_50 + pdVar3[uVar5];
      }
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool ComputeLowerAndUpperBounds(double confidence_level, int num_data,
                                const std::vector<double>& mean,
                                const std::vector<double>& variance,
                                std::vector<double>* lower_bound,
                                std::vector<double>* upper_bound) {
  if (confidence_level <= 0.0 || 100.0 <= confidence_level || num_data <= 0 ||
      mean.size() != variance.size() || NULL == lower_bound ||
      NULL == upper_bound) {
    return false;
  }

  if (lower_bound->size() != mean.size()) {
    lower_bound->resize(mean.size());
  }
  if (upper_bound->size() != mean.size()) {
    upper_bound->resize(mean.size());
  }

  const int degrees_of_freedom(num_data - 1);
  if (0 == degrees_of_freedom) {
    return false;
  }

  double t;
  if (!sptk::ComputePercentagePointOfTDistribution(
          0.5 * (1.0 - confidence_level / 100.0), degrees_of_freedom, &t)) {
    return false;
  }

  const double inverse_degrees_of_freedom(1.0 / degrees_of_freedom);
  const int vector_length(static_cast<int>(mean.size()));
  double* l(&((*lower_bound)[0]));
  double* u(&((*upper_bound)[0]));
  for (int i(0); i < vector_length; ++i) {
    const double error(std::sqrt(variance[i] * inverse_degrees_of_freedom));
    l[i] = mean[i] - t * error;
    u[i] = mean[i] + t * error;
  }

  return true;
}